

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckFacet(xmlSchemaFacetPtr facet,xmlSchemaTypePtr typeDecl,
                       xmlSchemaParserCtxtPtr pctxt,xmlChar *name)

{
  xmlGenericErrorFunc p_Var1;
  xmlNodePtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlSchemaParserCtxtPtr item;
  int iVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlSchemaAttributePtr_conflict pxVar8;
  xmlSchemaTypePtr pxVar9;
  xmlChar *pxVar10;
  char *str3;
  xmlChar *local_48;
  xmlChar *str;
  xmlSchemaTypePtr base;
  int ctxtGiven;
  int ret;
  xmlChar *name_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  xmlSchemaTypePtr typeDecl_local;
  xmlSchemaFacetPtr facet_local;
  
  base._4_4_ = 0;
  if ((facet == (xmlSchemaFacetPtr)0x0) || (typeDecl == (xmlSchemaTypePtr)0x0)) {
    return -1;
  }
  base._0_4_ = (uint)(pctxt != (xmlSchemaParserCtxtPtr)0x0);
  _ctxtGiven = name;
  name_local = (xmlChar *)pctxt;
  pctxt_local = (xmlSchemaParserCtxtPtr)typeDecl;
  typeDecl_local = (xmlSchemaTypePtr)facet;
  switch(facet->type) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
  case XML_SCHEMA_FACET_ENUMERATION:
    str = (xmlChar *)typeDecl;
    if ((typeDecl->type != XML_SCHEMA_TYPE_BASIC) &&
       (str = (xmlChar *)typeDecl->baseType, (xmlSchemaTypePtr)str == (xmlSchemaTypePtr)0x0)) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaCheckFacet",
                 "a type user derived type has no base type");
      return -1;
    }
    if (((uint)base == 0) &&
       (name_local = (xmlChar *)xmlSchemaNewParserCtxt("*"),
       (xmlSchemaParserCtxtPtr)name_local == (xmlSchemaParserCtxtPtr)0x0)) {
      return -1;
    }
    base._4_4_ = xmlSchemaVCheckCVCSimpleType
                           ((xmlSchemaAbstractCtxtPtr)name_local,(xmlNodePtr)typeDecl_local->refNs,
                            (xmlSchemaTypePtr)str,typeDecl_local->name,
                            (xmlSchemaValPtr *)&typeDecl_local->subtypes,1,1,0);
    pxVar9 = typeDecl_local;
    pxVar4 = name_local;
    if (base._4_4_ == 0) {
      if (typeDecl_local->subtypes == (xmlSchemaTypePtr)0x0) {
        if ((uint)base != 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)name_local,"xmlSchemaCheckFacet",
                     "value was not computed");
        }
        pp_Var6 = __xmlGenericError();
        p_Var1 = *pp_Var6;
        ppvVar7 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar7,"Unimplemented block at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
                  ,0x49c3);
      }
    }
    else {
      if (base._4_4_ < 0) {
        if ((uint)base != 0) {
          pxVar2 = (xmlNodePtr)typeDecl_local->refNs;
          pxVar3 = typeDecl_local->name;
          pxVar10 = xmlSchemaFacetTypeToString(typeDecl_local->type);
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar4,XML_SCHEMAP_INTERNAL,pxVar2,
                             (xmlSchemaBasicItemPtr)0x0,
                             "Internal error: xmlSchemaCheckFacet, failed to validate the value \'%s\' of the facet \'%s\' against the base type"
                             ,pxVar3,pxVar10);
        }
LAB_001ff999:
        if (((uint)base == 0) && (name_local != (xmlChar *)0x0)) {
          xmlSchemaFreeParserCtxt((xmlSchemaParserCtxtPtr)name_local);
        }
        return -1;
      }
      base._4_4_ = 0x6b5;
      if ((uint)base != 0) {
        local_48 = (xmlChar *)0x0;
        pxVar2 = (xmlNodePtr)typeDecl_local->refNs;
        pxVar3 = typeDecl_local->name;
        pxVar10 = xmlSchemaFormatQName
                            (&local_48,*(xmlChar **)(str + 0xd0),*(xmlChar **)(str + 0x10));
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar4,XML_SCHEMAP_INVALID_FACET_VALUE,pxVar2,
                           (xmlSchemaBasicItemPtr)pxVar9,
                           "The value \'%s\' of the facet does not validate against the base type \'%s\'"
                           ,pxVar3,pxVar10);
        if (local_48 != (xmlChar *)0x0) {
          (*xmlFree)(local_48);
          local_48 = (xmlChar *)0x0;
        }
      }
    }
    break;
  case XML_SCHEMA_FACET_TOTALDIGITS:
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
  case XML_SCHEMA_FACET_LENGTH:
  case XML_SCHEMA_FACET_MAXLENGTH:
  case XML_SCHEMA_FACET_MINLENGTH:
    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
      pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_PINTEGER);
      base._4_4_ = xmlSchemaValidatePredefinedType
                             (pxVar9,typeDecl_local->name,
                              (xmlSchemaValPtr *)&typeDecl_local->subtypes);
    }
    else {
      pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NNINTEGER);
      base._4_4_ = xmlSchemaValidatePredefinedType
                             (pxVar9,typeDecl_local->name,
                              (xmlSchemaValPtr *)&typeDecl_local->subtypes);
    }
    item = pctxt_local;
    pxVar4 = name_local;
    if (base._4_4_ != 0) {
      if (base._4_4_ < 0) {
        if ((uint)base != 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)name_local,"xmlSchemaCheckFacet",
                     "validating facet value");
        }
        goto LAB_001ff999;
      }
      base._4_4_ = 0x6b5;
      if ((uint)base != 0) {
        pxVar2 = (xmlNodePtr)typeDecl_local->refNs;
        pxVar3 = typeDecl_local->name;
        pxVar10 = xmlSchemaFacetTypeToString(typeDecl_local->type);
        str3 = "positiveInteger";
        if (typeDecl_local->type != XML_SCHEMA_FACET_TOTALDIGITS) {
          str3 = "nonNegativeInteger";
        }
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar4,XML_SCHEMAP_INVALID_FACET_VALUE,pxVar2,
                            (xmlSchemaBasicItemPtr)item,
                            "The value \'%s\' of the facet \'%s\' is not a valid \'%s\'",pxVar3,
                            pxVar10,(xmlChar *)str3,(xmlChar *)0x0);
      }
    }
    break;
  case XML_SCHEMA_FACET_PATTERN:
    pxVar8 = (xmlSchemaAttributePtr_conflict)xmlRegexpCompile(facet->value);
    typeDecl_local->attributes = pxVar8;
    if ((typeDecl_local->attributes == (xmlSchemaAttributePtr_conflict)0x0) &&
       (base._4_4_ = 0x6dc, (uint)base != 0)) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)name_local,XML_SCHEMAP_REGEXP_INVALID,
                         (xmlNodePtr)typeDecl_local->refNs,(xmlSchemaBasicItemPtr)pctxt_local,
                         "The value \'%s\' of the facet \'pattern\' is not a valid regular expression"
                         ,typeDecl_local->name,(xmlChar *)0x0);
    }
    break;
  case XML_SCHEMA_FACET_WHITESPACE:
    iVar5 = xmlStrEqual(facet->value,(xmlChar *)"preserve");
    if (iVar5 == 0) {
      iVar5 = xmlStrEqual(typeDecl_local->name,(xmlChar *)"replace");
      if (iVar5 == 0) {
        iVar5 = xmlStrEqual(typeDecl_local->name,(xmlChar *)"collapse");
        if (iVar5 == 0) {
          base._4_4_ = 0x6b5;
          if ((uint)base != 0) {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)name_local,XML_SCHEMAP_INVALID_FACET_VALUE,
                               (xmlNodePtr)typeDecl_local->refNs,(xmlSchemaBasicItemPtr)pctxt_local,
                               "The value \'%s\' of the facet \'whitespace\' is not valid",
                               typeDecl_local->name,(xmlChar *)0x0);
          }
        }
        else {
          *(undefined4 *)((long)&typeDecl_local->annot + 4) = 3;
        }
      }
      else {
        *(undefined4 *)((long)&typeDecl_local->annot + 4) = 2;
      }
    }
    else {
      *(undefined4 *)((long)&typeDecl_local->annot + 4) = 1;
    }
  }
  if (((uint)base == 0) && (name_local != (xmlChar *)0x0)) {
    xmlSchemaFreeParserCtxt((xmlSchemaParserCtxtPtr)name_local);
  }
  return base._4_4_;
}

Assistant:

int
xmlSchemaCheckFacet(xmlSchemaFacetPtr facet,
                    xmlSchemaTypePtr typeDecl,
                    xmlSchemaParserCtxtPtr pctxt,
		    const xmlChar * name ATTRIBUTE_UNUSED)
{
    int ret = 0, ctxtGiven;

    if ((facet == NULL) || (typeDecl == NULL))
        return(-1);
    /*
    * TODO: will the parser context be given if used from
    * the relaxNG module?
    */
    if (pctxt == NULL)
	ctxtGiven = 0;
    else
	ctxtGiven = 1;

    switch (facet->type) {
        case XML_SCHEMA_FACET_MININCLUSIVE:
        case XML_SCHEMA_FACET_MINEXCLUSIVE:
        case XML_SCHEMA_FACET_MAXINCLUSIVE:
        case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	case XML_SCHEMA_FACET_ENUMERATION: {
                /*
                 * Okay we need to validate the value
                 * at that point.
                 */
		xmlSchemaTypePtr base;

		/* 4.3.5.5 Constraints on enumeration Schema Components
		* Schema Component Constraint: enumeration valid restriction
		* It is an `error` if any member of {value} is not in the
		* `value space` of {base type definition}.
		*
		* minInclusive, maxInclusive, minExclusive, maxExclusive:
		* The value `must` be in the
		* `value space` of the `base type`.
		*/
		/*
		* This function is intended to deliver a compiled value
		* on the facet. In this implementation of XML Schemata the
		* type holding a facet, won't be a built-in type.
		* Thus to ensure that other API
		* calls (relaxng) do work, if the given type is a built-in
		* type, we will assume that the given built-in type *is
		* already* the base type.
		*/
		if (typeDecl->type != XML_SCHEMA_TYPE_BASIC) {
		    base = typeDecl->baseType;
		    if (base == NULL) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "a type user derived type has no base type");
			return (-1);
		    }
		} else
		    base = typeDecl;

		if (! ctxtGiven) {
		    /*
		    * A context is needed if called from RelaxNG.
		    */
		    pctxt = xmlSchemaNewParserCtxt("*");
		    if (pctxt == NULL)
			return (-1);
		}
		/*
		* NOTE: This call does not check the content nodes,
		* since they are not available:
		* facet->node is just the node holding the facet
		* definition, *not* the attribute holding the *value*
		* of the facet.
		*/
		ret = xmlSchemaVCheckCVCSimpleType(
		    ACTXT_CAST pctxt, facet->node, base,
		    facet->value, &(facet->val), 1, 1, 0);
                if (ret != 0) {
		    if (ret < 0) {
			/* No error message for RelaxNG. */
			if (ctxtGiven) {
			    xmlSchemaCustomErr(ACTXT_CAST pctxt,
				XML_SCHEMAP_INTERNAL, facet->node, NULL,
				"Internal error: xmlSchemaCheckFacet, "
				"failed to validate the value '%s' of the "
				"facet '%s' against the base type",
				facet->value, xmlSchemaFacetTypeToString(facet->type));
			}
			goto internal_error;
		    }
		    ret = XML_SCHEMAP_INVALID_FACET_VALUE;
		    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			xmlChar *str = NULL;

			xmlSchemaCustomErr(ACTXT_CAST pctxt,
			    ret, facet->node, WXS_BASIC_CAST facet,
			    "The value '%s' of the facet does not validate "
			    "against the base type '%s'",
			    facet->value,
			    xmlSchemaFormatQName(&str,
				base->targetNamespace, base->name));
			FREE_AND_NULL(str);
		    }
		    goto exit;
                } else if (facet->val == NULL) {
		    if (ctxtGiven) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "value was not computed");
		    }
		    TODO
		}
                break;
            }
        case XML_SCHEMA_FACET_PATTERN:
            facet->regexp = xmlRegexpCompile(facet->value);
            if (facet->regexp == NULL) {
		ret = XML_SCHEMAP_REGEXP_INVALID;
		/* No error message for RelaxNG. */
		if (ctxtGiven) {
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			ret, facet->node, WXS_BASIC_CAST typeDecl,
			"The value '%s' of the facet 'pattern' is not a "
			"valid regular expression",
			facet->value, NULL);
		}
            }
            break;
        case XML_SCHEMA_FACET_TOTALDIGITS:
        case XML_SCHEMA_FACET_FRACTIONDIGITS:
        case XML_SCHEMA_FACET_LENGTH:
        case XML_SCHEMA_FACET_MAXLENGTH:
        case XML_SCHEMA_FACET_MINLENGTH:

	    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
		ret = xmlSchemaValidatePredefinedType(
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_PINTEGER),
		    facet->value, &(facet->val));
	    } else {
		ret = xmlSchemaValidatePredefinedType(
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_NNINTEGER),
		    facet->value, &(facet->val));
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "validating facet value");
		    }
		    goto internal_error;
		}
		ret = XML_SCHEMAP_INVALID_FACET_VALUE;
		/* No error message for RelaxNG. */
		if (ctxtGiven) {
		    /* error code */
		    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
			ret, facet->node, WXS_BASIC_CAST typeDecl,
			"The value '%s' of the facet '%s' is not a valid '%s'",
			facet->value,
			xmlSchemaFacetTypeToString(facet->type),
			(facet->type != XML_SCHEMA_FACET_TOTALDIGITS) ?
			    BAD_CAST "nonNegativeInteger" :
			    BAD_CAST "positiveInteger",
			NULL);
		}
	    }
	    break;

        case XML_SCHEMA_FACET_WHITESPACE:{
                if (xmlStrEqual(facet->value, BAD_CAST "preserve")) {
                    facet->whitespace = XML_SCHEMAS_FACET_PRESERVE;
                } else if (xmlStrEqual(facet->value, BAD_CAST "replace")) {
                    facet->whitespace = XML_SCHEMAS_FACET_REPLACE;
                } else if (xmlStrEqual(facet->value, BAD_CAST "collapse")) {
                    facet->whitespace = XML_SCHEMAS_FACET_COLLAPSE;
                } else {
		    ret = XML_SCHEMAP_INVALID_FACET_VALUE;
                    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			/* error was previously: XML_SCHEMAP_INVALID_WHITE_SPACE */
			xmlSchemaCustomErr(ACTXT_CAST pctxt,
			    ret, facet->node, WXS_BASIC_CAST typeDecl,
			    "The value '%s' of the facet 'whitespace' is not "
			    "valid", facet->value, NULL);
                    }
                }
            }
        default:
            break;
    }
exit:
    if ((! ctxtGiven) && (pctxt != NULL))
	xmlSchemaFreeParserCtxt(pctxt);
    return (ret);
internal_error:
    if ((! ctxtGiven) && (pctxt != NULL))
	xmlSchemaFreeParserCtxt(pctxt);
    return (-1);
}